

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_monitor.c
# Opt level: O0

void outputHandleScale(void *userData,wl_output *output,int32_t factor)

{
  undefined8 local_38;
  size_t i;
  _GLFWwindow *window;
  _GLFWmonitor *monitor;
  int32_t factor_local;
  wl_output *output_local;
  void *userData_local;
  
  *(int32_t *)((long)userData + 0x118) = factor;
  i = (size_t)_glfw.windowListHead;
  do {
    if (i == 0) {
      return;
    }
    for (local_38 = 0; local_38 < *(ulong *)(i + 0x410); local_38 = local_38 + 1) {
      if (*(long *)(*(long *)(i + 0x408) + local_38 * 0x10) == *(long *)((long)userData + 0x100)) {
        *(undefined4 *)(*(long *)(i + 0x408) + local_38 * 0x10 + 8) =
             *(undefined4 *)((long)userData + 0x118);
        _glfwUpdateBufferScaleFromOutputsWayland((_GLFWwindow *)i);
        break;
      }
    }
    i = *(size_t *)i;
  } while( true );
}

Assistant:

static void outputHandleScale(void* userData,
                              struct wl_output* output,
                              int32_t factor)
{
    struct _GLFWmonitor* monitor = userData;

    monitor->wl.scale = factor;

    for (_GLFWwindow* window = _glfw.windowListHead; window; window = window->next)
    {
        for (size_t i = 0; i < window->wl.outputScaleCount; i++)
        {
            if (window->wl.outputScales[i].output == monitor->wl.output)
            {
                window->wl.outputScales[i].factor = monitor->wl.scale;
                _glfwUpdateBufferScaleFromOutputsWayland(window);
                break;
            }
        }
    }
}